

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::ServiceDescriptor::DebugString(ServiceDescriptor *this,string *contents)

{
  long lVar1;
  long lVar2;
  SubstituteArg local_208;
  SubstituteArg local_1d8;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  SubstituteArg local_118;
  SubstituteArg local_e8;
  SubstituteArg local_b8;
  SubstituteArg local_88;
  SubstituteArg local_58;
  
  local_58.text_ = (char *)**(undefined8 **)this;
  local_58.size_ = *(int *)(*(undefined8 **)this + 1);
  local_88.text_ = (char *)0x0;
  local_88.size_ = -1;
  local_b8.text_ = (char *)0x0;
  local_b8.size_ = -1;
  local_e8.text_ = (char *)0x0;
  local_e8.size_ = -1;
  local_118.text_ = (char *)0x0;
  local_118.size_ = -1;
  local_148.text_ = (char *)0x0;
  local_148.size_ = -1;
  local_178.text_ = (char *)0x0;
  local_178.size_ = -1;
  local_1a8.text_ = (char *)0x0;
  local_1a8.size_ = -1;
  local_1d8.text_ = (char *)0x0;
  local_1d8.size_ = -1;
  local_208.text_ = (char *)0x0;
  local_208.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"service $0 {\n",&local_58,&local_88,&local_b8,&local_e8,&local_118,&local_148
             ,&local_178,&local_1a8,&local_1d8,&local_208);
  anon_unknown_1::FormatLineOptions(1,*(Message **)(this + 0x18),contents);
  if (0 < *(int *)(this + 0x20)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      MethodDescriptor::DebugString((MethodDescriptor *)(*(long *)(this + 0x28) + lVar2),1,contents)
      ;
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x30;
    } while (lVar1 < *(int *)(this + 0x20));
  }
  std::__cxx11::string::append((char *)contents);
  return;
}

Assistant:

void ServiceDescriptor::DebugString(string *contents) const {
  strings::SubstituteAndAppend(contents, "service $0 {\n", name());

  FormatLineOptions(1, options(), contents);

  for (int i = 0; i < method_count(); i++) {
    method(i)->DebugString(1, contents);
  }

  contents->append("}\n");
}